

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::hash(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
             vector<int,_std::allocator<int>_> *su)

{
  iterator __position;
  int iVar1;
  byte bVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  int iVar6;
  uint *puVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int local_3c;
  Arcflow *local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)hash::last_size);
  piVar4 = (su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (0 < (int)((ulong)((long)piVar5 - (long)piVar4) >> 2)) {
    lVar10 = 0;
    puVar7 = (uint *)0x0;
    iVar1 = 0;
    do {
      iVar6 = (local_38->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      if (iVar6 != 0) {
        uVar11 = piVar4[lVar10];
        do {
          if (iVar1 == 0) {
            local_3c = 0;
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (__return_storage_ptr__,__position,&local_3c);
              piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *__position._M_current = 0;
              piVar8 = __position._M_current + 1;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = piVar8;
            }
            puVar7 = (uint *)(piVar8 + -1);
            iVar1 = 0x20;
          }
          iVar3 = iVar6;
          if (iVar1 < iVar6) {
            iVar3 = iVar1;
          }
          bVar2 = (byte)iVar3;
          uVar9 = ~(-1 << (bVar2 & 0x1f)) & uVar11;
          uVar11 = (int)uVar11 >> (bVar2 & 0x1f);
          *puVar7 = uVar9 | *puVar7 << (bVar2 & 0x1f);
          iVar1 = iVar1 - iVar3;
          iVar6 = iVar6 - iVar3;
        } while (iVar6 != 0);
        piVar4 = (su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                 ._M_start;
        piVar5 = (su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                 ._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)piVar5 - (long)piVar4) >> 2));
  }
  hash::last_size =
       (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> Arcflow::hash(const std::vector<int> &su) {
	static int last_size = 1;
	std::vector<int> h;
	h.reserve(last_size);
	int *p = NULL, dst_bits = 0;
	for (int i = 0; i < static_cast<int>(su.size()); i++) {
		int x = su[i];
		int src_bits = hash_bits[i];
		while (src_bits != 0) {
			if (dst_bits == 0) {
				h.push_back(0);
				p = &h.back();
				dst_bits = sizeof(int) * 8;
			}
			int window_width = std::min(src_bits, dst_bits);
			*p <<= window_width;
			*p |= x & ((1u << window_width) - 1);
			x >>= window_width;
			src_bits -= window_width;
			dst_bits -= window_width;
		}
	}
	last_size = h.size();
	return h;
}